

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# directory.cpp
# Opt level: O1

void __thiscall directory::grow(directory *this)

{
  pointer puVar1;
  uint uVar2;
  ulong uVar3;
  
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
            (&this->bucket_ids,(long)(1 << ((char)this->depth + 1U & 0x1f)));
  uVar2 = this->bucket_size;
  if (uVar2 != 0) {
    puVar1 = (this->bucket_ids).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
             _M_impl.super__Vector_impl_data._M_start;
    uVar3 = 0;
    do {
      puVar1[(int)(1L << ((byte)this->depth & 0x3f)) + (int)uVar3] = puVar1[uVar3];
      uVar3 = uVar3 + 1;
      uVar2 = this->bucket_size;
    } while (uVar3 < uVar2);
  }
  this->bucket_size = uVar2 * 2;
  this->depth = this->depth + 1;
  return;
}

Assistant:

void directory::grow() {

    int double_size = 1 << depth + 1;

    bucket_ids.resize(double_size);

    for (int i = 0; i < bucket_size; ++i) {
        bucket_ids[i + (1 << depth)] = bucket_ids[i];
    }

    bucket_size = bucket_size << 1;

    depth++;
}